

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

Node * __thiscall
TMap<int,_FString,_THashTraits<int>,_TValueTraits<FString>_>::GetNode
          (TMap<int,_FString,_THashTraits<int>,_TValueTraits<FString>_> *this,int key)

{
  Node *pNVar1;
  
  pNVar1 = FindKey(this,key);
  if (pNVar1 == (Node *)0x0) {
    pNVar1 = NewKey(this,key);
    (pNVar1->Pair).Value.Chars = FString::NullString.Nothing;
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
  }
  return pNVar1;
}

Assistant:

Node *GetNode(const KT key)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			return n;
		}
		n = NewKey(key);
		ValueTraits traits;
		traits.Init(n->Pair.Value);
		return n;
	}